

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>
          (Promise<void> *this,Own<kj::AsyncInputStream> *attachments,String *attachments_1,
          Own<kj::HttpHeaders> *attachments_2)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::AsyncInputStream> *this_00;
  Own<kj::AsyncInputStream> *params_00;
  Own<kj::HttpHeaders> *params_1;
  PromiseNode *extraout_RDX;
  Own<kj::HttpHeaders> *in_R8;
  Promise<void> PVar1;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  local_88;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
  local_50;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::HttpHeaders> *local_30;
  Own<kj::HttpHeaders> *attachments_local_2;
  String *attachments_local_1;
  Own<kj::AsyncInputStream> *attachments_local;
  Promise<void> *this_local;
  
  local_30 = in_R8;
  attachments_local_2 = attachments_2;
  attachments_local_1 = attachments_1;
  attachments_local = attachments;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  this_00 = fwd<kj::Own<kj::AsyncInputStream>>
                      ((NoInfer<kj::Own<kj::AsyncInputStream>_> *)attachments_local_1);
  params_00 = (Own<kj::AsyncInputStream> *)
              fwd<kj::String>((NoInfer<kj::String> *)attachments_local_2);
  params_1 = fwd<kj::Own<kj::HttpHeaders>>(local_30);
  tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>
            (&local_88,(kj *)this_00,params_00,(String *)params_1,in_R8);
  heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>
            ((kj *)&local_50,params,&local_88);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>,void>
            (&local_40,&local_50);
  Promise(this,false,&local_40);
  Own<kj::_::PromiseNode>::~Own(&local_40);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
  ::~Own(&local_50);
  _::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>::~Tuple(&local_88);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}